

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::Promise<int>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<int>_>_>::
reject(AdapterPromiseNode<kj::Promise<int>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<int>_>_>
       *this,Exception *exception)

{
  ExceptionOr<kj::Promise<int>_> local_190;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_190,exception);
    local_190.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<int>_>::operator=(&this->result,&local_190);
    ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&local_190);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }